

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::
     iuUniversalPrinter<std::tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int>_>::Print
               (tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *value,iu_ostream *os)

{
  iu_ostream *os_local;
  tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *value_local;
  
  UniversalPrintTo<std::tuple<int,int,int,int,int,int,int,int,int,int>>(value,os);
  return;
}

Assistant:

static void Print(const T& value, iu_ostream* os)
    {
        UniversalPrintTo(value, os);
    }